

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDVertex::IsSharp(ON_SubDVertex *this,bool bEndCheck)

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  bool bVar3;
  ON_SubDEdge *this_00;
  ulong uVar4;
  
  if ((((this->m_vertex_tag < 5) && ((0x16U >> (this->m_vertex_tag & 0x1f) & 1) != 0)) &&
      (pOVar2 = this->m_edges, pOVar2 != (ON_SubDEdgePtr *)0x0)) &&
     (uVar1 = this->m_edge_count, (ulong)uVar1 != 0)) {
    uVar4 = 0;
    do {
      this_00 = (ON_SubDEdge *)(pOVar2[uVar4].m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) && (bVar3 = ON_SubDEdge::IsSharp(this_00), bVar3)) {
        return true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return false;
}

Assistant:

bool ON_SubDVertex::IsSmoothOrDartOrCrease() const
{
  return (ON_SubDVertexTag::Smooth == m_vertex_tag || ON_SubDVertexTag::Dart == m_vertex_tag || ON_SubDVertexTag::Crease == m_vertex_tag);
}